

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O2

int lex_scan(lex_t *lex,json_error_t *error)

{
  strbuffer_t *strbuff;
  size_t *psVar1;
  char byte;
  json_error_code code;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  size_t sVar8;
  byte *buffer;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  char *pcVar9;
  byte *pbVar10;
  byte *pbVar11;
  bool bVar12;
  char *end;
  char *local_38;
  
  strbuff = &lex->saved_text;
  strbuffer_clear(strbuff);
  if (lex->token == 0x100) {
    lex_free_string(lex);
  }
  do {
    uVar3 = stream_get(&lex->stream,error);
    uVar7 = (ulong)(uVar3 + 2);
    if (0x22 < uVar3 + 2) goto LAB_00117f7f;
  } while ((0x400009800U >> (uVar7 & 0x3f) & 1) != 0);
  if (uVar7 == 0) {
LAB_0011818f:
    lex->token = -1;
    goto LAB_00118193;
  }
  if (uVar7 == 1) {
    lex->token = 0;
    goto LAB_00118193;
  }
LAB_00117f7f:
  strbuffer_append_byte(strbuff,(char)uVar3);
  uVar7 = (ulong)(uVar3 - 0x22);
  if (uVar3 - 0x22 < 0x3c) {
    if ((0xa00000001000400U >> (uVar7 & 0x3f) & 1) == 0) {
      if (uVar7 == 0) {
        (lex->value).string.val = (char *)0x0;
        lex->token = -1;
switchD_0011802e_caseD_6e:
        uVar3 = lex_get_save(lex,error);
LAB_00117fdc:
        if (uVar3 != 0xfffffffe) {
          if (uVar3 != 0x22) {
            if (uVar3 == 0xffffffff) {
              pcVar9 = "premature end of input";
              code = json_error_premature_end_of_input;
              goto LAB_001183db;
            }
            if (0x1f < uVar3) goto code_r0x00118007;
            lex_unget_unsave(lex,uVar3);
            if (uVar3 == 10) {
              pcVar9 = "unexpected newline";
              goto LAB_001183d9;
            }
            pcVar9 = "control character 0x%x";
            goto LAB_001184db;
          }
          buffer = (byte *)jsonp_malloc((lex->saved_text).length + 1);
          if (buffer == (byte *)0x0) goto LAB_001183e9;
          (lex->value).string.val = (char *)buffer;
          pcVar9 = strbuffer_value(strbuff);
          pbVar10 = (byte *)(pcVar9 + 1);
          goto LAB_001182a6;
        }
        goto LAB_001183e9;
      }
      goto LAB_001180a1;
    }
  }
  else {
LAB_001180a1:
    if ((uVar3 != 0x7d) && (uVar3 != 0x7b)) {
      if (uVar3 != 0x2d && 9 < uVar3 - 0x30) {
        if ((uVar3 & 0xffffffdf) - 0x41 < 0x1a) {
          do {
            uVar3 = lex_get_save(lex,error);
          } while ((uVar3 & 0xffffffdf) - 0x41 < 0x1a);
          lex_unget_unsave(lex,uVar3);
          pcVar9 = strbuffer_value(strbuff);
          uVar3 = strcmp(pcVar9,"true");
          uVar7 = (ulong)uVar3;
          if (uVar3 == 0) {
            lex->token = 0x103;
            goto LAB_00118193;
          }
          uVar3 = strcmp(pcVar9,"false");
          uVar7 = (ulong)uVar3;
          if (uVar3 == 0) {
            lex->token = 0x104;
            goto LAB_00118193;
          }
          uVar3 = strcmp(pcVar9,"null");
          uVar7 = (ulong)uVar3;
          if (uVar3 == 0) {
            lex->token = 0x105;
            goto LAB_00118193;
          }
        }
        else {
          sVar8 = (lex->stream).buffer_pos;
          while( true ) {
            byte = (lex->stream).buffer[sVar8];
            uVar7 = CONCAT71((int7)(sVar8 >> 8),byte);
            if (byte == '\0') break;
            strbuffer_append_byte(strbuff,byte);
            sVar8 = (lex->stream).buffer_pos + 1;
            (lex->stream).buffer_pos = sVar8;
            psVar1 = &(lex->stream).position;
            *psVar1 = *psVar1 + 1;
          }
        }
        goto LAB_0011818f;
      }
      lex->token = -1;
      if (uVar3 == 0x2d) {
        uVar3 = lex_get_save(lex,error);
      }
      if (uVar3 == 0x30) {
        uVar3 = lex_get_save(lex,error);
        if (9 < uVar3 - 0x30) {
LAB_001181c3:
          if ((lex->flags & 8) == 0) {
            if (uVar3 == 0x2e) {
LAB_00118406:
              iVar5 = stream_get(&lex->stream,error);
              if (9 < iVar5 - 0x30U) {
                stream_unget(&lex->stream,iVar5);
                uVar7 = extraout_RAX_02;
                goto LAB_00118193;
              }
              strbuffer_append_byte(strbuff,(char)iVar5);
              do {
                uVar3 = lex_get_save(lex,error);
              } while (uVar3 - 0x30 < 10);
              goto LAB_0011843d;
            }
            if ((uVar3 == 0x45) || (uVar3 == 0x65)) goto LAB_0011843d;
            lex_unget_unsave(lex,uVar3);
            pcVar9 = strbuffer_value(strbuff);
            piVar6 = __errno_location();
            *piVar6 = 0;
            uVar7 = strtoll(pcVar9,&end,10);
            if (*piVar6 != 0x22) {
              if (end != pcVar9 + (lex->saved_text).length) {
                __assert_fail("end == saved_text + lex->saved_text.length",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/jansson/load.c"
                              ,0x1ff,"int lex_scan_number(lex_t *, int, json_error_t *)");
              }
              lex->token = 0x101;
              (lex->value).integer = uVar7;
              goto LAB_00118193;
            }
            if ((long)uVar7 < 0) {
              pcVar9 = "too big negative integer";
            }
            else {
              pcVar9 = "too big integer";
            }
          }
          else {
            if (uVar3 == 0x2e) goto LAB_00118406;
LAB_0011843d:
            if ((uVar3 & 0xffffffdf) == 0x45) {
              uVar3 = lex_get_save(lex,error);
              if ((uVar3 == 0x2d) || (uVar3 == 0x2b)) {
                uVar3 = lex_get_save(lex,error);
              }
              if (9 < uVar3 - 0x30) goto LAB_001184be;
              do {
                uVar3 = lex_get_save(lex,error);
              } while (uVar3 - 0x30 < 10);
            }
            lex_unget_unsave(lex,uVar3);
            uVar3 = jsonp_strtod(strbuff,(double *)&local_38);
            uVar7 = (ulong)uVar3;
            if (uVar3 == 0) {
              lex->token = 0x102;
              (lex->value).string.val = local_38;
              goto LAB_00118193;
            }
            pcVar9 = "real number overflow";
          }
          error_set(error,lex,json_error_numeric_overflow,pcVar9);
          uVar7 = extraout_RAX_00;
          goto LAB_00118193;
        }
      }
      else if (uVar3 - 0x30 < 10) {
        do {
          uVar3 = lex_get_save(lex,error);
        } while (uVar3 - 0x30 < 10);
        goto LAB_001181c3;
      }
LAB_001184be:
      lex_unget_unsave(lex,uVar3);
      uVar7 = extraout_RAX_01;
      goto LAB_00118193;
    }
  }
  lex->token = uVar3;
LAB_00118193:
  return (int)uVar7;
code_r0x00118007:
  uVar4 = lex_get_save(lex,error);
  bVar12 = uVar3 == 0x5c;
  uVar3 = uVar4;
  if (bVar12) {
    switch(uVar4) {
    case 0x6e:
    case 0x72:
    case 0x74:
      goto switchD_0011802e_caseD_6e;
    case 0x75:
      uVar3 = lex_get_save(lex,error);
      iVar5 = 4;
      while (bVar12 = iVar5 != 0, iVar5 = iVar5 + -1, bVar12) {
        if ((9 < uVar3 - 0x30) &&
           ((0x25 < uVar3 - 0x41 || ((0x3f0000003fU >> ((ulong)(uVar3 - 0x41) & 0x3f) & 1) == 0))))
        goto switchD_0011802e_caseD_6f;
        uVar3 = lex_get_save(lex,error);
      }
      break;
    default:
      if (((uVar4 - 0x2f < 0x38) && ((0x88200000000001U >> ((ulong)(uVar4 - 0x2f) & 0x3f) & 1) != 0)
          ) || (uVar4 == 0x22)) goto switchD_0011802e_caseD_6e;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
switchD_0011802e_caseD_6f:
      pcVar9 = "invalid escape";
LAB_001183d9:
      code = json_error_invalid_syntax;
LAB_001183db:
      error_set(error,lex,code,pcVar9);
      goto LAB_001183e9;
    }
  }
  goto LAB_00117fdc;
LAB_001182a6:
  bVar2 = *pbVar10;
  uVar7 = (ulong)bVar2;
  if (bVar2 == 0x5c) {
    bVar2 = pbVar10[1];
    switch(bVar2) {
    case 0x6e:
      bVar2 = 10;
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
switchD_001182fb_caseD_6f:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/jansson/load.c"
                    ,0x1b7,"void lex_scan_string(lex_t *, json_error_t *)");
    case 0x72:
      bVar2 = 0xd;
      break;
    case 0x74:
      bVar2 = 9;
      break;
    case 0x75:
      uVar3 = decode_unicode_escape((char *)(pbVar10 + 1));
      pbVar11 = pbVar10;
      if ((int)uVar3 < 0) {
LAB_001185b5:
        error_set(error,lex,json_error_invalid_syntax,"invalid Unicode escape \'%.6s\'",pbVar11);
        goto LAB_001183e9;
      }
      pbVar11 = pbVar10 + 6;
      if ((uVar3 & 0x7ffffc00) == 0xd800) {
        if ((*pbVar11 != 0x5c) || (pbVar10[7] != 0x75)) {
LAB_00118569:
          pcVar9 = "invalid Unicode \'\\u%04X\'";
LAB_001184db:
          error_set(error,lex,json_error_invalid_syntax,pcVar9,(ulong)uVar3);
LAB_001183e9:
          lex_free_string(lex);
          uVar7 = extraout_RAX;
          goto LAB_00118193;
        }
        uVar4 = decode_unicode_escape((char *)(pbVar10 + 7));
        if ((int)uVar4 < 0) goto LAB_001185b5;
        if ((uVar4 & 0x7ffffc00) != 0xdc00) {
          error_set(error,lex,json_error_invalid_syntax,"invalid Unicode \'\\u%04X\\u%04X\'",
                    (ulong)uVar3,(ulong)uVar4);
          goto LAB_001183e9;
        }
        pbVar11 = pbVar10 + 0xc;
        uVar3 = uVar3 * 0x400 + uVar4 + 0xfca02400;
      }
      else if ((uVar3 & 0x7ffffc00) == 0xdc00) goto LAB_00118569;
      iVar5 = utf8_encode(uVar3,(char *)buffer,(size_t *)&end);
      if (iVar5 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/jansson/load.c"
                      ,0x19e,"void lex_scan_string(lex_t *, json_error_t *)");
      }
      buffer = buffer + (long)end;
      pbVar10 = pbVar11;
      goto LAB_001182a6;
    default:
      if (((bVar2 != 0x22) && (bVar2 != 0x2f)) && (bVar2 != 0x5c)) {
        if (bVar2 == 0x62) {
          bVar2 = 8;
        }
        else {
          if (bVar2 != 0x66) goto switchD_001182fb_caseD_6f;
          bVar2 = 0xc;
        }
      }
    }
    *buffer = bVar2;
    buffer = buffer + 1;
    pbVar10 = pbVar10 + 2;
    goto LAB_001182a6;
  }
  if (bVar2 == 0x22) goto LAB_001184f3;
  *buffer = bVar2;
  buffer = buffer + 1;
  pbVar10 = pbVar10 + 1;
  goto LAB_001182a6;
LAB_001184f3:
  *buffer = 0;
  (lex->value).string.len = (long)buffer - (lex->value).integer;
  lex->token = 0x100;
  goto LAB_00118193;
}

Assistant:

static int lex_scan(lex_t *lex, json_error_t *error) {
    int c;

    strbuffer_clear(&lex->saved_text);

    if (lex->token == TOKEN_STRING)
        lex_free_string(lex);

    do
        c = lex_get(lex, error);
    while (c == ' ' || c == '\t' || c == '\n' || c == '\r');

    if (c == STREAM_STATE_EOF) {
        lex->token = TOKEN_EOF;
        goto out;
    }

    if (c == STREAM_STATE_ERROR) {
        lex->token = TOKEN_INVALID;
        goto out;
    }

    lex_save(lex, c);

    if (c == '{' || c == '}' || c == '[' || c == ']' || c == ':' || c == ',')
        lex->token = c;

    else if (c == '"')
        lex_scan_string(lex, error);

    else if (l_isdigit(c) || c == '-') {
        if (lex_scan_number(lex, c, error))
            goto out;
    } else if (l_isalpha(c)) {
        /* eat up the whole identifier for clearer error messages */
        const char *saved_text;

        do
            c = lex_get_save(lex, error);
        while (l_isalpha(c));
        lex_unget_unsave(lex, c);

        saved_text = strbuffer_value(&lex->saved_text);

        if (strcmp(saved_text, "true") == 0)
            lex->token = TOKEN_TRUE;
        else if (strcmp(saved_text, "false") == 0)
            lex->token = TOKEN_FALSE;
        else if (strcmp(saved_text, "null") == 0)
            lex->token = TOKEN_NULL;
        else
            lex->token = TOKEN_INVALID;
    } else {
        /* save the rest of the input UTF-8 sequence to get an error
           message of valid UTF-8 */
        lex_save_cached(lex);
        lex->token = TOKEN_INVALID;
    }

    out:
    return lex->token;
}